

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O0

_tPseudoDtSels * __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels<yactfr::internal::PseudoVarType>
          (_tPseudoDtSels *__return_storage_ptr__,DtFromPseudoRootDtConverter *this,
          PseudoVarType *pseudoDt)

{
  bool bVar1;
  optional<yactfr::DataLocation> *poVar2;
  reference_const_type pDVar3;
  undefined1 local_60 [8];
  ConstPseudoDtSet pseudoSelDts;
  PseudoVarType *pseudoDt_local;
  DtFromPseudoRootDtConverter *this_local;
  
  pseudoSelDts._M_h._M_single_bucket = (__node_base_ptr)pseudoDt;
  poVar2 = PseudoVarType::selLoc(pseudoDt);
  bVar1 = boost::optional<yactfr::DataLocation>::operator!(poVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("pseudoDt.selLoc()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x33d,
                  "DtFromPseudoRootDtConverter::_tPseudoDtSels yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT &) const [PseudoDtT = yactfr::internal::PseudoVarType]"
                 );
  }
  poVar2 = PseudoVarType::selLoc((PseudoVarType *)pseudoSelDts._M_h._M_single_bucket);
  pDVar3 = boost::optional<yactfr::DataLocation>::operator*(poVar2);
  _findPseudoDts((ConstPseudoDtSet *)local_60,this,pDVar3,
                 (PseudoDt *)pseudoSelDts._M_h._M_single_bucket);
  bVar1 = std::
          unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
          ::empty((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                   *)local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!pseudoSelDts.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x341,
                  "DtFromPseudoRootDtConverter::_tPseudoDtSels yactfr::internal::DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT &) const [PseudoDtT = yactfr::internal::PseudoVarType]"
                 );
  }
  poVar2 = PseudoVarType::selLoc((PseudoVarType *)pseudoSelDts._M_h._M_single_bucket);
  pDVar3 = boost::optional<yactfr::DataLocation>::operator*(poVar2);
  std::
  pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
  ::
  pair<std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>,_true>
            (__return_storage_ptr__,pDVar3,
             (unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
              *)local_60);
  std::
  unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
  ::~unordered_set((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                    *)local_60);
  return __return_storage_ptr__;
}

Assistant:

DtFromPseudoRootDtConverter::_tPseudoDtSels DtFromPseudoRootDtConverter::_pseudoDtSels(const PseudoDtT& pseudoDt) const
{
    assert(pseudoDt.selLoc());

    auto pseudoSelDts = this->_findPseudoDts(*pseudoDt.selLoc(), pseudoDt);

    assert(!pseudoSelDts.empty());
    return {*pseudoDt.selLoc(), std::move(pseudoSelDts)};
}